

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_date_constructor(JSContext *ctx,JSValue new_target,int argc,JSValue *argv)

{
  void *pvVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  JSValueUnion JVar8;
  JSValue *pJVar9;
  int64_t *piVar10;
  int64_t iVar11;
  bool bVar12;
  anon_union_8_2_94730072 u;
  double dVar13;
  JSValue ctor;
  JSValue JVar14;
  JSValue JVar15;
  JSValue JVar16;
  JSValue val_00;
  JSValue val_01;
  double val;
  timeval tv;
  double a;
  JSValueUnion local_98;
  uint local_8c;
  JSValueUnion local_88;
  ulong local_80;
  JSValueUnion local_78;
  long lStack_70;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined8 local_48;
  ulong local_40;
  double local_38;
  JSValue *argv_00;
  
  uVar7 = new_target.tag;
  JVar8 = new_target.u;
  local_40 = uVar7 & 0xffffffff;
  uVar5 = 0;
  if (local_40 != 3) {
    uVar5 = (ulong)(uint)argc;
  }
  iVar3 = (int)uVar5;
  if (iVar3 == 1) {
    local_88 = JVar8;
    if ((int)argv->tag == -1) {
      pvVar1 = (argv->u).ptr;
      bVar12 = false;
      bVar2 = true;
      if (*(short *)((long)pvVar1 + 6) == 10) {
        iVar3 = (int)*(int64_t *)((long)pvVar1 + 0x38);
        if ((iVar3 == 7) || (iVar3 == 0)) {
          JVar15.tag = *(int64_t *)((long)pvVar1 + 0x38);
          JVar15.u.ptr = ((JSValueUnion *)((long)pvVar1 + 0x30))->ptr;
          iVar3 = JS_ToFloat64(ctx,&local_98.float64,JVar15);
          if (iVar3 == 0) {
            if (ABS(local_98.float64) <= 8.64e+15) {
              dVar13 = trunc(local_98.float64);
              local_98.float64 = dVar13 + 0.0;
            }
            else {
              local_98.float64 = NAN;
            }
            bVar12 = false;
          }
          else {
            bVar12 = true;
          }
          bVar2 = false;
        }
      }
      if (bVar2) goto LAB_001319ec;
    }
    else {
LAB_001319ec:
      JVar8 = (JSValueUnion)(argv->u).ptr;
      JVar15 = *argv;
      local_78 = (JSValueUnion)(JSValueUnion)JVar8.ptr;
      if (0xfffffff4 < (uint)argv->tag) {
        *(int *)JVar8.ptr = *JVar8.ptr + 1;
      }
      iVar3 = 2;
      JVar15 = JS_ToPrimitiveFree(ctx,JVar15,2);
      JVar14.tag = JVar15.tag;
      val_00.u = JVar15.u;
      uVar6 = (uint)JVar15.tag;
      _local_78 = JVar15;
      if (uVar6 == 0xfffffff9) {
        JVar14.u.ptr = JVar8.ptr;
        JVar14 = js_Date_parse(ctx,JVar14,iVar3,(JSValue *)&local_78);
        iVar3 = *val_00.u.ptr;
        *(int *)val_00.u.ptr = iVar3 + -1;
        if (iVar3 < 2) {
          __JS_FreeValueRT(ctx->rt,JVar15);
        }
        bVar12 = true;
        uVar6 = (uint)JVar14.tag;
        if (uVar6 == 6) goto LAB_00131b13;
        if (uVar6 < 3) {
          iVar3 = JVar14.u._0_4_;
          goto LAB_00131a89;
        }
        val_00.u = JVar14.u;
        if (uVar6 != 7) {
          iVar3 = __JS_ToFloat64Free(ctx,&local_98.float64,JVar14);
          goto LAB_00131ad1;
        }
      }
      else if (uVar6 < 3) {
        iVar3 = JVar15.u._0_4_;
LAB_00131a89:
        val_00.u.float64 = (double)iVar3;
      }
      else if (uVar6 != 7) {
        iVar3 = __JS_ToFloat64Free(ctx,&local_98.float64,JVar15);
LAB_00131ad1:
        bVar12 = true;
        val_00.u = local_98;
        if (iVar3 != 0) goto LAB_00131b13;
      }
      local_98 = val_00.u;
      if (ABS(local_98.float64) <= 8.64e+15) {
        dVar13 = trunc(local_98.float64);
        local_98.float64 = dVar13 + 0.0;
      }
      else {
        local_98.float64 = NAN;
      }
      bVar12 = false;
    }
LAB_00131b13:
    JVar8 = local_88;
    if (bVar12) {
LAB_00131c17:
      iVar11 = 6;
      uVar5 = 0;
      uVar7 = 0;
      goto LAB_00131c02;
    }
  }
  else if (iVar3 == 0) {
    gettimeofday((timeval *)&local_78,(__timezone_ptr_t)0x0);
    local_98.float64 = (double)(lStack_70 / 1000 + (long)local_78.ptr * 1000);
  }
  else {
    local_58 = (undefined1  [16])0x0;
    local_78 = (JSValueUnion)0x0;
    lStack_70 = 0;
    local_48 = 0;
    local_68 = ZEXT816(0x3ff0000000000000);
    uVar4 = 7;
    if (iVar3 < 7) {
      uVar4 = uVar5;
    }
    local_80 = uVar7;
    if (iVar3 < 1) {
      uVar5 = 0;
      uVar6 = (uint)uVar4;
    }
    else {
      piVar10 = &argv->tag;
      uVar5 = 0;
      local_8c = (uint)uVar4;
      local_88 = JVar8;
      do {
        val_01.tag = *piVar10;
        val_01.u.ptr = ((JSValueUnion *)(piVar10 + -1))->ptr;
        iVar3 = JS_ToFloat64(ctx,&local_38,val_01);
        if (iVar3 != 0) goto LAB_00131c17;
        JVar8 = local_88;
        uVar6 = local_8c;
        if (0x7fefffffffffffff < (ulong)ABS(local_38)) goto LAB_00131974;
        dVar13 = trunc(local_38);
        (&local_78)[uVar5].float64 = dVar13;
        if (((uVar5 == 0) && (0.0 <= local_78.float64)) && (local_78.float64 < 100.0)) {
          local_78.float64 = local_78.float64 + 1900.0;
        }
        uVar5 = uVar5 + 1;
        piVar10 = piVar10 + 2;
      } while (uVar4 != uVar5);
      uVar5 = (ulong)local_8c;
      JVar8 = local_88;
      uVar6 = local_8c;
    }
LAB_00131974:
    if ((uint)uVar5 == uVar6) {
      local_98.float64 = set_date_fields(&local_78.float64,1);
      uVar7 = local_80;
    }
    else {
      local_98.float64 = NAN;
      uVar7 = local_80;
    }
  }
  ctor.tag = uVar7;
  ctor.u.float64 = JVar8.float64;
  JVar14 = js_create_from_ctor(ctx,ctor,10);
  JVar8 = JVar14.u;
  JVar15 = JVar14;
  if ((JVar14.tag & 0xffffffffU) != 6) {
    bVar12 = (int)local_40 == 3;
    uVar5 = (ulong)local_98.ptr & 0xffffffff;
    pJVar9 = (JSValue *)((ulong)local_98.ptr & 0xffffffff00000000);
    if ((int *)local_98.ptr == (int *)(double)(int)local_98.float64) {
      uVar5 = (ulong)(uint)(int)local_98.float64;
      pJVar9 = (JSValue *)0x0;
    }
    argv_00 = (JSValue *)0x7;
    if ((int *)local_98.ptr == (int *)(double)(int)local_98.float64) {
      argv_00 = (JSValue *)0x0;
    }
    val_00.u.ptr = (void *)(uVar5 | (ulong)pJVar9);
    val_00.tag = (int64_t)argv_00;
    JS_SetObjectData(ctx,JVar14,val_00);
    if (bVar12 && (uint)JVar14.tag != 6) {
      JVar15 = get_date_string(ctx,JVar14,val_00.u.int32,argv_00,0x13);
      local_78.float64 = JVar8.float64;
      if ((0xfffffff4 < (uint)JVar14.tag) &&
         (iVar3 = *JVar8.ptr, *(int *)JVar8.ptr = iVar3 + -1, iVar3 < 2)) {
        __JS_FreeValueRT(ctx->rt,JVar14);
      }
    }
  }
  iVar11 = JVar15.tag;
  uVar7 = (ulong)JVar15.u.ptr & 0xffffffff00000000;
  uVar5 = (ulong)JVar15.u.ptr & 0xffffffff;
LAB_00131c02:
  JVar16.u.ptr = (void *)(uVar5 | uVar7);
  JVar16.tag = iVar11;
  return JVar16;
}

Assistant:

static JSValue js_date_constructor(JSContext *ctx, JSValueConst new_target,
                                   int argc, JSValueConst *argv)
{
    // Date(y, mon, d, h, m, s, ms)
    JSValue rv;
    int i, n;
    double a, val;

    if (JS_IsUndefined(new_target)) {
        /* invoked as function */
        argc = 0;
    }
    n = argc;
    if (n == 0) {
        val = date_now();
    } else if (n == 1) {
        JSValue v, dv;
        if (JS_VALUE_GET_TAG(argv[0]) == JS_TAG_OBJECT) {
            JSObject *p = JS_VALUE_GET_OBJ(argv[0]);
            if (p->class_id == JS_CLASS_DATE && JS_IsNumber(p->u.object_data)) {
                if (JS_ToFloat64(ctx, &val, p->u.object_data))
                    return JS_EXCEPTION;
                val = time_clip(val);
                goto has_val;
            }
        }
        v = JS_ToPrimitive(ctx, argv[0], HINT_NONE);
        if (JS_IsString(v)) {
            dv = js_Date_parse(ctx, JS_UNDEFINED, 1, (JSValueConst *)&v);
            JS_FreeValue(ctx, v);
            if (JS_IsException(dv))
                return JS_EXCEPTION;
            if (JS_ToFloat64Free(ctx, &val, dv))
                return JS_EXCEPTION;
        } else {
            if (JS_ToFloat64Free(ctx, &val, v))
                return JS_EXCEPTION;
        }
        val = time_clip(val);
    } else {
        double fields[] = { 0, 0, 1, 0, 0, 0, 0 };
        if (n > 7)
            n = 7;
        for(i = 0; i < n; i++) {
            if (JS_ToFloat64(ctx, &a, argv[i]))
                return JS_EXCEPTION;
            if (!isfinite(a))
                break;
            fields[i] = trunc(a);
            if (i == 0 && fields[0] >= 0 && fields[0] < 100)
                fields[0] += 1900;
        }
        val = (i == n) ? set_date_fields(fields, 1) : NAN;
    }
has_val:
#if 0
    JSValueConst args[3];
    args[0] = new_target;
    args[1] = ctx->class_proto[JS_CLASS_DATE];
    args[2] = JS_NewFloat64(ctx, val);
    rv = js___date_create(ctx, JS_UNDEFINED, 3, args);
#else
    rv = js_create_from_ctor(ctx, new_target, JS_CLASS_DATE);
    if (!JS_IsException(rv))
        JS_SetObjectData(ctx, rv, JS_NewFloat64(ctx, val));
#endif
    if (!JS_IsException(rv) && JS_IsUndefined(new_target)) {
        /* invoked as a function, return (new Date()).toString(); */
        JSValue s;
        s = get_date_string(ctx, rv, 0, NULL, 0x13);
        JS_FreeValue(ctx, rv);
        rv = s;
    }
    return rv;
}